

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema.c
# Opt level: O0

void lys_augment_free(ly_ctx *ctx,lys_node_augment *aug,
                     _func_void_lys_node_ptr_void_ptr *private_destructor)

{
  lys_node *plVar1;
  lys_node *local_30;
  lys_node *sub;
  lys_node *next;
  _func_void_lys_node_ptr_void_ptr *private_destructor_local;
  lys_node_augment *aug_local;
  ly_ctx *ctx_local;
  
  if ((aug->target == (lys_node *)0x0) || ((aug->flags & 1) != 0)) {
    local_30 = aug->child;
    while (local_30 != (lys_node *)0x0) {
      plVar1 = local_30->next;
      lys_node_free(local_30,private_destructor,0);
      local_30 = plVar1;
    }
  }
  lydict_remove(ctx,aug->target_name);
  lydict_remove(ctx,aug->dsc);
  lydict_remove(ctx,aug->ref);
  lys_iffeature_free(ctx,aug->iffeature,aug->iffeature_size);
  lys_extension_instances_free(ctx,aug->ext,(uint)aug->ext_size);
  lys_when_free(ctx,aug->when);
  return;
}

Assistant:

static void
lys_augment_free(struct ly_ctx *ctx, struct lys_node_augment *aug, void (*private_destructor)(const struct lys_node *node, void *priv))
{
    struct lys_node *next, *sub;

    /* children from a resolved augment are freed under the target node */
    if (!aug->target || (aug->flags & LYS_NOTAPPLIED)) {
        LY_TREE_FOR_SAFE(aug->child, next, sub) {
            lys_node_free(sub, private_destructor, 0);
        }
    }

    lydict_remove(ctx, aug->target_name);
    lydict_remove(ctx, aug->dsc);
    lydict_remove(ctx, aug->ref);

    lys_iffeature_free(ctx, aug->iffeature, aug->iffeature_size);
    lys_extension_instances_free(ctx, aug->ext, aug->ext_size);

    lys_when_free(ctx, aug->when);
}